

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O2

void init_proc_602(CPUPPCState_conflict2 *env)

{
  int nb_ways;
  CPUPPCState_conflict3 *__mptr;
  int nb_tlbs;
  
  gen_spr_ne_601(env);
  gen_spr_sdr1(env);
  _spr_register(env,0x3df,"SER",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3de,"SEBR",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3db,"ESASRR",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3fd,"SP",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3fe,"LT",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3d8,"TCR",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3da,"IBR",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3f2,"IABR",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  gen_tbl(env);
  _spr_register(env,0x3f0,"HID0",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  nb_tlbs = 0x3f1;
  _spr_register(env,0x3f1,"HID1",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  gen_low_BATs(env);
  gen_6xx_7xx_soft_tlb(env,nb_tlbs,nb_ways);
  env->excp_vectors[0x40] = 0x100;
  env->excp_vectors[1] = 0x200;
  env->excp_vectors[2] = 0x300;
  env->excp_vectors[3] = 0x400;
  env->excp_vectors[4] = 0x500;
  env->excp_vectors[5] = 0x600;
  env->excp_vectors[6] = 0x700;
  env->excp_vectors[7] = 0x800;
  env->excp_vectors[10] = 0x900;
  env->excp_vectors[8] = 0xc00;
  env->excp_vectors[0x44] = 0xd00;
  env->excp_vectors[0x4e] = 0x1000;
  env->excp_vectors[0x4f] = 0x1100;
  env->excp_vectors[0x50] = 0x1200;
  env->excp_vectors[0x53] = 0x1300;
  env->excp_vectors[0x54] = 0x1400;
  env->excp_vectors[0xc] = 0x1500;
  env->excp_vectors[0x4d] = 0x1600;
  env->hreset_vector = 0x100;
  env->dcache_line_size = 0x20;
  env->icache_line_size = 0x20;
  ppc6xx_irq_init_ppc64((PowerPCCPU_conflict3 *)&env[-1].spr_cb[0x1bf].oea_write);
  return;
}

Assistant:

static void init_proc_602(CPUPPCState *env)
{
    gen_spr_ne_601(env);
    gen_spr_sdr1(env);
    gen_spr_602(env);
    /* Time base */
    gen_tbl(env);
    /* hardware implementation registers */
    /* XXX : not implemented */
    spr_register(env, SPR_HID0, "HID0",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_HID1, "HID1",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Memory management */
    gen_low_BATs(env);
    gen_6xx_7xx_soft_tlb(env, 64, 2);
    init_excp_602(env);
    env->dcache_line_size = 32;
    env->icache_line_size = 32;
    /* Allocate hardware IRQ controller */
    ppc6xx_irq_init(env_archcpu(env));
}